

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatastream.h
# Opt level: O2

QDataStream *
QtPrivate::writeSequentialContainer<QList<QList<QString>>>(QDataStream *s,QList<QList<QString>_> *c)

{
  bool bVar1;
  value_type *t;
  QList<QString> *c_00;
  long lVar2;
  
  bVar1 = QDataStream::writeQSizeType(s,(c->d).size);
  if (bVar1) {
    c_00 = (c->d).ptr;
    for (lVar2 = (c->d).size * 0x18; lVar2 != 0; lVar2 = lVar2 + -0x18) {
      writeSequentialContainer<QList<QString>>(s,c_00);
      c_00 = c_00 + 1;
    }
  }
  return s;
}

Assistant:

QDataStream &writeSequentialContainer(QDataStream &s, const Container &c)
{
    if (!QDataStream::writeQSizeType(s, c.size()))
        return s;
    for (const typename Container::value_type &t : c)
        s << t;

    return s;
}